

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_linear.h
# Opt level: O0

void XrMatrix4x4f_CreateTranslationRotationScale
               (XrMatrix4x4f *result,XrVector3f *translation,XrQuaternionf *rotation,
               XrVector3f *scale)

{
  undefined1 local_128 [8];
  XrMatrix4x4f combinedMatrix;
  XrMatrix4x4f translationMatrix;
  XrMatrix4x4f rotationMatrix;
  XrMatrix4x4f scaleMatrix;
  XrVector3f *scale_local;
  XrQuaternionf *rotation_local;
  XrVector3f *translation_local;
  XrMatrix4x4f *result_local;
  
  XrMatrix4x4f_CreateScale((XrMatrix4x4f *)(rotationMatrix.m + 0xe),scale->x,scale->y,scale->z);
  XrMatrix4x4f_CreateFromQuaternion((XrMatrix4x4f *)(translationMatrix.m + 0xe),rotation);
  XrMatrix4x4f_CreateTranslation
            ((XrMatrix4x4f *)(combinedMatrix.m + 0xe),translation->x,translation->y,translation->z);
  XrMatrix4x4f_Multiply
            ((XrMatrix4x4f *)local_128,(XrMatrix4x4f *)(translationMatrix.m + 0xe),
             (XrMatrix4x4f *)(rotationMatrix.m + 0xe));
  XrMatrix4x4f_Multiply(result,(XrMatrix4x4f *)(combinedMatrix.m + 0xe),(XrMatrix4x4f *)local_128);
  return;
}

Assistant:

inline static void XrMatrix4x4f_CreateTranslationRotationScale(XrMatrix4x4f* result, const XrVector3f* translation,
                                                               const XrQuaternionf* rotation, const XrVector3f* scale) {
    XrMatrix4x4f scaleMatrix;
    XrMatrix4x4f_CreateScale(&scaleMatrix, scale->x, scale->y, scale->z);

    XrMatrix4x4f rotationMatrix;
    XrMatrix4x4f_CreateFromQuaternion(&rotationMatrix, rotation);

    XrMatrix4x4f translationMatrix;
    XrMatrix4x4f_CreateTranslation(&translationMatrix, translation->x, translation->y, translation->z);

    XrMatrix4x4f combinedMatrix;
    XrMatrix4x4f_Multiply(&combinedMatrix, &rotationMatrix, &scaleMatrix);
    XrMatrix4x4f_Multiply(result, &translationMatrix, &combinedMatrix);
}